

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flat_file.c
# Opt level: O1

void ftest_insert(planck_unit_test_t *tc,ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value,
                 ion_err_t expected_status,ion_result_count_t expected_count,
                 ion_boolean_t check_result)

{
  FILE *pFVar1;
  planck_unit_result_t pVar2;
  char cVar3;
  ion_err_t iVar4;
  int iVar5;
  ion_status_t iVar6;
  ulong uVar7;
  undefined7 in_register_00000081;
  long lVar8;
  undefined1 *__s2;
  size_t sVar9;
  undefined1 *__ptr;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  undefined1 local_60 [8];
  ion_flat_file_row_t test_row;
  
  uStack_70 = 0x101466;
  iVar6 = flat_file_insert(flat_file,key,value);
  uStack_70 = 0x101484;
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,(int32_t)CONCAT71(in_register_00000081,expected_status),(int)iVar6.error,
                     0x83,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                    );
  __ptr = auStack_68;
  if (pVar2 != '\0') {
    uStack_70 = 0x1014aa;
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,expected_count,iVar6.count,0x84,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                      );
    __ptr = auStack_68;
    if (pVar2 != '\0') {
      if (check_result != '\0') {
        uVar7 = flat_file->row_size + 0xf & 0xfffffffffffffff0;
        lVar8 = -uVar7;
        __s2 = auStack_68 + lVar8;
        test_row.value = auStack_68;
        auStack_68[-uVar7] = 1;
        sVar9 = (size_t)(flat_file->super).record.key_size;
        *(undefined8 *)(auStack_68 + lVar8 + -8) = 0x1014f3;
        memcpy(auStack_68 + lVar8 + 1,key,sVar9);
        iVar5 = (flat_file->super).record.value_size;
        *(undefined8 *)(auStack_68 + lVar8 + -8) = 0x101507;
        memcpy(__s2 + sVar9 + 1,value,(long)iVar5);
        __ptr = __s2 + -(flat_file->row_size + 0xf & 0xfffffffffffffff0);
        lVar8 = flat_file->start_of_data;
        pFVar1 = (FILE *)flat_file->data_file;
        *(undefined8 *)(__ptr + -8) = 0x10152b;
        fseek(pFVar1,lVar8,0);
        pFVar1 = (FILE *)flat_file->data_file;
        sVar9 = flat_file->row_size;
        *(undefined8 *)(__ptr + -8) = 0x101540;
        sVar9 = fread(__ptr,sVar9,1,pFVar1);
        if (sVar9 == 1) {
          lVar8 = 0;
          do {
            sVar9 = flat_file->row_size;
            *(undefined8 *)(__ptr + -8) = 0x101558;
            iVar5 = bcmp(__ptr,__s2,sVar9);
            if (iVar5 == 0) {
              *(undefined8 *)(__ptr + -8) = 0x1015ab;
              iVar4 = flat_file_read_row(flat_file,lVar8,(ion_flat_file_row_t *)local_60);
              *(undefined8 *)(__ptr + -8) = 0x1015c4;
              pVar2 = planck_unit_assert_int_are_equal
                                (tc,0,(int)iVar4,0x9c,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                                );
              if (pVar2 == '\0') goto LAB_0010165a;
              *(undefined8 *)(__ptr + -8) = 0x1015e9;
              pVar2 = planck_unit_assert_int_are_equal
                                (tc,1,(uint)local_60[0],0x9d,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                                );
              if (pVar2 == '\0') goto LAB_0010165a;
              iVar5 = (flat_file->super).record.key_size;
              *(undefined8 *)(__ptr + -8) = 0x1015fe;
              iVar5 = memcmp((void *)test_row._0_8_,key,(long)iVar5);
              *(undefined8 *)(__ptr + -8) = 0x101616;
              pVar2 = planck_unit_assert_int_are_equal
                                (tc,0,iVar5,0x9e,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                                );
              if (pVar2 == '\0') goto LAB_0010165a;
              iVar5 = (flat_file->super).record.value_size;
              *(undefined8 *)(__ptr + -8) = 0x10162b;
              iVar5 = memcmp(test_row.key,value,(long)iVar5);
              *(undefined8 *)(__ptr + -8) = 0x101643;
              cVar3 = planck_unit_assert_int_are_equal
                                (tc,0,iVar5,0x9f,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                                );
              goto LAB_00101643;
            }
            lVar8 = lVar8 + 1;
            pFVar1 = (FILE *)flat_file->data_file;
            sVar9 = flat_file->row_size;
            *(undefined8 *)(__ptr + -8) = 0x101574;
            sVar9 = fread(__ptr,sVar9,1,pFVar1);
          } while (sVar9 == 1);
        }
        *(undefined8 *)(__ptr + -8) = 0x101597;
        cVar3 = planck_unit_assert_true
                          (tc,0,0xa7,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                           ,"asserted to fail");
LAB_00101643:
        if (cVar3 == '\0') goto LAB_0010165a;
      }
      return;
    }
  }
LAB_0010165a:
  *(code **)(__ptr + -8) = ftest_delete;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
ftest_insert(
	planck_unit_test_t	*tc,
	ion_flat_file_t		*flat_file,
	ion_key_t			key,
	ion_value_t			value,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count,
	ion_boolean_t		check_result
) {
	ion_status_t status = flat_file_insert(flat_file, key, value);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (check_result) {
		ion_byte_t expected_result[flat_file->row_size];

		memset(expected_result, ION_FLAT_FILE_STATUS_OCCUPIED, sizeof(ion_flat_file_row_status_t));
		memcpy(expected_result + sizeof(ion_flat_file_row_status_t), key, flat_file->super.record.key_size);
		memcpy(expected_result + sizeof(ion_flat_file_row_status_t) + flat_file->super.record.key_size, value, flat_file->super.record.value_size);

		ion_byte_t read_buffer[flat_file->row_size];

		fseek(flat_file->data_file, flat_file->start_of_data, SEEK_SET);

		ion_fpos_t cur_index = 0;

		while (boolean_true) {
			if (1 != fread(read_buffer, flat_file->row_size, 1, flat_file->data_file)) {
				break;
			}

			if (0 == memcmp(read_buffer, expected_result, flat_file->row_size)) {
				ion_flat_file_row_t test_row;
				ion_err_t			err = flat_file_read_row(flat_file, cur_index, &test_row);

				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ION_FLAT_FILE_STATUS_OCCUPIED, test_row.row_status);
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(test_row.key, key, flat_file->super.record.key_size));
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(test_row.value, value, flat_file->super.record.value_size));
				return;
			}

			cur_index++;
		}

		/* If we reach here that means that the record we were looking for wasn't found :( */
		PLANCK_UNIT_SET_FAIL(tc);
	}
}